

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O2

void calc_vector_mean_sse_64wd(int16_t *ref,int16_t *src,__m256i *mean,__m256i *sse)

{
  __m256i alVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  
  auVar5 = vpsubw_avx2(*(undefined1 (*) [32])ref,*(undefined1 (*) [32])src);
  auVar6 = vpsubw_avx2(*(undefined1 (*) [32])(ref + 0x10),*(undefined1 (*) [32])(src + 0x10));
  auVar7 = vpsubw_avx2(*(undefined1 (*) [32])(ref + 0x20),*(undefined1 (*) [32])(src + 0x20));
  auVar8 = vpsubw_avx2(*(undefined1 (*) [32])(ref + 0x30),*(undefined1 (*) [32])(src + 0x30));
  auVar2 = vpmaddwd_avx2(auVar5,auVar5);
  auVar3 = vpmaddwd_avx2(auVar6,auVar6);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar3 = vpmaddwd_avx2(auVar7,auVar7);
  auVar4 = vpmaddwd_avx2(auVar8,auVar8);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar4 = vpaddd_avx2(auVar2,auVar3);
  auVar2 = vpaddw_avx2(auVar6,auVar5);
  auVar3 = vpaddw_avx2(auVar7,auVar8);
  auVar2 = vpaddw_avx2(auVar2,auVar3);
  alVar1 = (__m256i)vpaddw_avx2(auVar2,(undefined1  [32])*mean);
  *mean = alVar1;
  alVar1 = (__m256i)vpaddd_avx2(auVar4,(undefined1  [32])*sse);
  *sse = alVar1;
  return;
}

Assistant:

static inline void calc_vector_mean_sse_64wd(const int16_t *ref,
                                             const int16_t *src, __m256i *mean,
                                             __m256i *sse) {
  const __m256i src_line0 = _mm256_loadu_si256((const __m256i *)src);
  const __m256i src_line1 = _mm256_loadu_si256((const __m256i *)(src + 16));
  const __m256i src_line2 = _mm256_loadu_si256((const __m256i *)(src + 32));
  const __m256i src_line3 = _mm256_loadu_si256((const __m256i *)(src + 48));
  const __m256i ref_line0 = _mm256_loadu_si256((const __m256i *)ref);
  const __m256i ref_line1 = _mm256_loadu_si256((const __m256i *)(ref + 16));
  const __m256i ref_line2 = _mm256_loadu_si256((const __m256i *)(ref + 32));
  const __m256i ref_line3 = _mm256_loadu_si256((const __m256i *)(ref + 48));

  const __m256i diff0 = _mm256_sub_epi16(ref_line0, src_line0);
  const __m256i diff1 = _mm256_sub_epi16(ref_line1, src_line1);
  const __m256i diff2 = _mm256_sub_epi16(ref_line2, src_line2);
  const __m256i diff3 = _mm256_sub_epi16(ref_line3, src_line3);
  const __m256i diff_sqr0 = _mm256_madd_epi16(diff0, diff0);
  const __m256i diff_sqr1 = _mm256_madd_epi16(diff1, diff1);
  const __m256i diff_sqr2 = _mm256_madd_epi16(diff2, diff2);
  const __m256i diff_sqr3 = _mm256_madd_epi16(diff3, diff3);

  *mean = _mm256_add_epi16(*mean, _mm256_add_epi16(diff0, diff1));
  *mean = _mm256_add_epi16(*mean, diff2);
  *mean = _mm256_add_epi16(*mean, diff3);
  *sse = _mm256_add_epi32(*sse, _mm256_add_epi32(diff_sqr0, diff_sqr1));
  *sse = _mm256_add_epi32(*sse, diff_sqr2);
  *sse = _mm256_add_epi32(*sse, diff_sqr3);
}